

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

TaskHandle __thiscall
Task::fromJson(Task *this,int id,
              vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands
              ,json *json)

{
  long lVar1;
  shared_ptr<Operand> *psVar2;
  key_type *pkVar3;
  bool bVar4;
  const_reference pvVar5;
  unsigned_long uVar6;
  ulong uVar7;
  size_type sVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Task *this_00;
  OperandUsage *usage;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  double dVar10;
  TaskHandle TVar11;
  anon_class_24_1_ca163648 fill;
  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
  ins;
  anon_class_24_1_ca163648 local_80;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  
  std::make_shared<Task>();
  std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::vector
            (&local_80.operands,operands);
  **(int **)this = id;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"name");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,pvVar5);
  std::__cxx11::string::operator=((string *)(*(long *)this + 8),(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  lVar1 = *(long *)this;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"ins");
  fromJson::anon_class_24_1_ca163648::operator()
            (&local_80,(vector<OperandUsage,_std::allocator<OperandUsage>_> *)(lVar1 + 0x30),pvVar5)
  ;
  lVar1 = *(long *)this;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"outs");
  fromJson::anon_class_24_1_ca163648::operator()
            (&local_80,(vector<OperandUsage,_std::allocator<OperandUsage>_> *)(lVar1 + 0x48),pvVar5)
  ;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"workspace");
  uVar6 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get<unsigned_long,_unsigned_long,_0>(pvVar5);
  *(unsigned_long *)(*(long *)this + 0x28) = uVar6;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"time");
  dVar10 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::get<double,_double,_0>(pvVar5);
  uVar7 = (ulong)(dVar10 * 1000.0);
  *(ulong *)(*(long *)this + 0x60) =
       (long)(dVar10 * 1000.0 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
  pvVar5 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"attr");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_38,pvVar5);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)(*(long *)this + 0xb8),&local_38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_38);
  local_68._24_8_ = local_68 + 8;
  local_68._8_4_ = _S_red;
  local_68._16_8_ = 0;
  local_40 = 0;
  psVar2 = *(shared_ptr<Operand> **)(*(long *)this + 0x38);
  local_48 = (_Base_ptr)local_68._24_8_;
  for (p_Var9 = *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x30);
      (shared_ptr<Operand> *)p_Var9 != psVar2; p_Var9 = p_Var9 + 0xd) {
    std::
    _Rb_tree<std::shared_ptr<Operand>,std::shared_ptr<Operand>,std::_Identity<std::shared_ptr<Operand>>,std::less<std::shared_ptr<Operand>>,std::allocator<std::shared_ptr<Operand>>>
    ::_M_insert_unique<std::shared_ptr<Operand>const&>
              ((_Rb_tree<std::shared_ptr<Operand>,std::shared_ptr<Operand>,std::_Identity<std::shared_ptr<Operand>>,std::less<std::shared_ptr<Operand>>,std::allocator<std::shared_ptr<Operand>>>
                *)local_68,(shared_ptr<Operand> *)p_Var9);
  }
  lVar1 = *(long *)this;
  *(undefined1 *)(lVar1 + 0x68) = 0;
  p_Var9 = *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x48);
  pkVar3 = *(key_type **)(lVar1 + 0x50);
  do {
    if ((key_type *)p_Var9 == pkVar3) {
      this_00 = *(Task **)this;
      goto LAB_00127b63;
    }
    sVar8 = std::
            set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
            ::count((set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                     *)local_68,(key_type *)p_Var9);
    p_Var9 = p_Var9 + 0xd;
  } while (sVar8 == 0);
  this_00 = *(Task **)this;
  this_00->inplace = true;
LAB_00127b63:
  bVar4 = isForbidden(this_00);
  if (!bVar4) {
    std::
    _Rb_tree<std::shared_ptr<Operand>,_std::shared_ptr<Operand>,_std::_Identity<std::shared_ptr<Operand>_>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<Operand>,_std::shared_ptr<Operand>,_std::_Identity<std::shared_ptr<Operand>_>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
                 *)local_68);
    std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::~vector
              (&local_80.operands);
    TVar11.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    TVar11.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (TaskHandle)TVar11.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("not task->isForbidden()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                ,0xcb,
                "static TaskHandle Task::fromJson(int, const std::vector<OperandHandle> &, const nlohmann::json &)"
               );
}

Assistant:

static TaskHandle fromJson(int id, const std::vector<OperandHandle> &operands, const nlohmann::json &json) {
        auto task = std::make_shared<Task>();
        auto fill = [operands](std::vector<OperandUsage> &vec, const nlohmann::json &array) {
            vec.resize(array.size());
            // Python processor has already assumed `arch == "CUDA"`
            for (int i = 0; i < vec.size(); ++ i) {
                vec[i] = OperandUsage{ operands[static_cast<int>(array[i])] };
            }
        };

        // Fill task
        task->id = id;
        task->name = json["name"];
        fill(task->ins, json["ins"]);
        fill(task->outs, json["outs"]);
        task->workspace = json["workspace"];
        task->duration = Unit::us(static_cast<double>(json["time"]));
        task->attr = json["attr"];

        // Detect inplace
        std::set<OperandHandle> ins;
        for (auto &usage: task->ins) {
            ins.insert(usage.operand);
        }
        task->inplace = false;
        for (auto &usage: task->outs) {
            if (ins.count(usage.operand)) {
                task->inplace = true;
                break;
            }
        }

        assert(not task->isForbidden());
        return task;
    }